

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int *piVar2;
  EventLoop *this;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  TimerId TVar3;
  _Any_data local_12f8;
  code *pcStack_12e8;
  undefined8 uStack_12e0;
  char *local_348 [5];
  undefined1 local_320 [8];
  EventLoop loop;
  string local_1b8;
  TimerCallback local_198;
  _Any_data local_178;
  code *pcStack_168;
  code *pcStack_160;
  _Any_data local_158;
  code *pcStack_148;
  code *pcStack_140;
  _Any_data local_138;
  code *pcStack_128;
  code *pcStack_120;
  _Any_data local_118;
  code *pcStack_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *pcStack_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *pcStack_88;
  code *pcStack_80;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  
  printid();
  local_12f8._M_unused._M_member_pointer = 1;
  local_12f8._8_8_ = 0;
  do {
    iVar1 = nanosleep((timespec *)&local_12f8,(timespec *)&local_12f8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  sznet::net::EventLoop::EventLoop((EventLoop *)local_320);
  g_timequeue_loop = (EventLoop *)local_320;
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x17;
    file.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger((Logger *)&local_12f8,file,0x32);
    if (4 < (uint)((int)local_348 - (int)local_348[0])) {
      builtin_strncpy(local_348[0],"main",4);
      local_348[0] = local_348[0] + 4;
    }
    sznet::Logger::~Logger((Logger *)&local_12f8);
  }
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  pcStack_168 = (code *)0x0;
  pcStack_160 = (code *)0x0;
  local_178._M_unused._M_object = operator_new(0x10);
  *(code **)local_178._M_unused._0_8_ = print;
  pcStack_160 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_invoke;
  *(char **)((long)local_178._M_unused._0_8_ + 8) = "once1";
  pcStack_168 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,1.0,(TimerCallback *)&local_178);
  if (pcStack_168 != (code *)0x0) {
    (*pcStack_168)(&local_178,&local_178,__destroy_functor);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  pcStack_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = operator_new(0x10);
  *(code **)local_158._M_unused._0_8_ = print;
  pcStack_140 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_invoke;
  *(char **)((long)local_158._M_unused._0_8_ + 8) = "once1.5";
  pcStack_148 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,1.5,(TimerCallback *)&local_158);
  if (pcStack_148 != (code *)0x0) {
    (*pcStack_148)(&local_158,&local_158,__destroy_functor);
  }
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  pcStack_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = operator_new(0x10);
  *(code **)local_138._M_unused._0_8_ = print;
  pcStack_120 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_invoke;
  *(char **)((long)local_138._M_unused._0_8_ + 8) = "every2";
  pcStack_128 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_manager;
  sznet::net::EventLoop::runEvery((EventLoop *)local_320,2.0,(TimerCallback *)&local_138);
  if (pcStack_128 != (code *)0x0) {
    (*pcStack_128)(&local_138,&local_138,__destroy_functor);
  }
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = operator_new(0x10);
  *(code **)local_118._M_unused._0_8_ = print;
  pcStack_100 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_invoke;
  *(char **)((long)local_118._M_unused._0_8_ + 8) = "once2.5";
  pcStack_108 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
                _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,2.5,(TimerCallback *)&local_118);
  if (pcStack_108 != (code *)0x0) {
    (*pcStack_108)(&local_118,&local_118,__destroy_functor);
  }
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  pcStack_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = operator_new(0x10);
  *(code **)local_f8._M_unused._0_8_ = print;
  pcStack_e0 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_invoke;
  *(char **)((long)local_f8._M_unused._0_8_ + 8) = "once3.5";
  pcStack_e8 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,3.5,(TimerCallback *)&local_f8);
  if (pcStack_e8 != (code *)0x0) {
    (*pcStack_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x10);
  *(code **)local_d8._M_unused._0_8_ = print;
  pcStack_c0 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_invoke;
  *(char **)((long)local_d8._M_unused._0_8_ + 8) = "once4.5";
  pcStack_c8 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_manager;
  TVar3 = sznet::net::EventLoop::runAfter((EventLoop *)local_320,4.5,(TimerCallback *)&local_d8);
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(code **)local_b8._M_unused._0_8_ = cancel;
  pcStack_a0 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_invoke;
  *(TimerId *)((long)local_b8._M_unused._0_8_ + 8) = TVar3;
  pcStack_a8 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,4.2,(TimerCallback *)&local_b8);
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  pcStack_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = operator_new(0x18);
  *(code **)local_98._M_unused._0_8_ = cancel;
  *(TimerId *)((long)local_98._M_unused._0_8_ + 8) = TVar3;
  pcStack_80 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_invoke;
  pcStack_88 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,4.8,(TimerCallback *)&local_98);
  if (pcStack_88 != (code *)0x0) {
    (*pcStack_88)(&local_98,&local_98,__destroy_functor);
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  pcStack_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x10);
  *(code **)local_78._M_unused._0_8_ = print;
  *(char **)((long)local_78._M_unused._0_8_ + 8) = "every3";
  pcStack_60 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_invoke;
  pcStack_68 = std::_Function_handler<void_(),_std::_Bind<void_(*(const_char_*))(const_char_*)>_>::
               _M_manager;
  TVar3 = sznet::net::EventLoop::runEvery((EventLoop *)local_320,3.0,(TimerCallback *)&local_78);
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,__destroy_functor);
  }
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  pcStack_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = cancel;
  *(TimerId *)((long)local_58._M_unused._0_8_ + 8) = TVar3;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_invoke;
  pcStack_48 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(sznet::TimerId))(sznet::TimerId)>_>::
               _M_manager;
  sznet::net::EventLoop::runAfter((EventLoop *)local_320,9.001,(TimerCallback *)&local_58);
  if (pcStack_48 != (code *)0x0) {
    (*pcStack_48)(&local_58,&local_58,__destroy_functor);
  }
  sznet::net::EventLoop::loop((EventLoop *)local_320);
  if (sznet::g_logLevel < 3) {
    file_00._8_8_ = 0x17;
    file_00.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger((Logger *)&local_12f8,file_00,0x40);
    if (((int)local_348 - (int)local_348[0] & 0xfffffff0U) != 0) {
      builtin_strncpy(local_348[0],"main loop exits",0xf);
      local_348[0] = local_348[0] + 0xf;
    }
    sznet::Logger::~Logger((Logger *)&local_12f8);
  }
  sznet::net::EventLoop::~EventLoop((EventLoop *)local_320);
  local_12f8._M_unused._M_member_pointer = 1;
  local_12f8._8_8_ = 0;
  do {
    iVar1 = nanosleep((timespec *)&local_12f8,(timespec *)&local_12f8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_1b8._M_string_length = 0;
  local_12f8._M_unused._M_object = (void *)0x0;
  local_12f8._8_8_ = 0;
  pcStack_12e8 = (code *)0x0;
  uStack_12e0 = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  sznet::net::EventLoopThread::EventLoopThread
            ((EventLoopThread *)local_320,(ThreadInitCallback *)&local_12f8,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (pcStack_12e8 != (code *)0x0) {
    (*pcStack_12e8)(&local_12f8,&local_12f8,__destroy_functor);
  }
  this = sznet::net::EventLoopThread::startLoop((EventLoopThread *)local_320);
  local_198.super__Function_base._M_functor._8_8_ = 0;
  local_198.super__Function_base._M_functor._M_unused._M_object = printid;
  local_198._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_198.super__Function_base._M_manager =
       std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  sznet::net::EventLoop::runAfter(this,2.0,&local_198);
  if (local_198.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_198.super__Function_base._M_manager)
              ((_Any_data *)&local_198,(_Any_data *)&local_198,__destroy_functor);
  }
  local_12f8._M_unused._M_member_pointer = 3;
  local_12f8._8_8_ = 0;
  do {
    iVar1 = nanosleep((timespec *)&local_12f8,(timespec *)&local_12f8);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (sznet::g_logLevel < 3) {
    file_01._8_8_ = 0x17;
    file_01.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger((Logger *)&local_12f8,file_01,0x48);
    if (0x11 < (uint)((int)local_348 - (int)local_348[0])) {
      builtin_strncpy(local_348[0],"thread loop exits",0x11);
      local_348[0] = local_348[0] + 0x11;
    }
    sznet::Logger::~Logger((Logger *)&local_12f8);
  }
  sznet::net::EventLoopThread::~EventLoopThread((EventLoopThread *)local_320);
  std::istream::get();
  return 0;
}

Assistant:

int main()
{
	printid();
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoop loop;
		g_timequeue_loop = &loop;

		LOG_INFO << "main";
		loop.runAfter(1, std::bind(print, "once1"));
		loop.runAfter(1.5, std::bind(print, "once1.5"));
		loop.runEvery(2, std::bind(print, "every2"));
		loop.runAfter(2.5, std::bind(print, "once2.5"));
		loop.runAfter(3.5, std::bind(print, "once3.5"));

		TimerId t45 = loop.runAfter(4.5, std::bind(print, "once4.5"));
		loop.runAfter(4.2, std::bind(cancel, t45));
		loop.runAfter(4.8, std::bind(cancel, t45));
		TimerId t3 = loop.runEvery(3, std::bind(print, "every3"));
		loop.runAfter(9.001, std::bind(cancel, t3));

		loop.loop();
		LOG_INFO << "main loop exits";
	}
	std::this_thread::sleep_for(std::chrono::seconds(1));
	{
		EventLoopThread loopThread;
		EventLoop* loop = loopThread.startLoop();
		loop->runAfter(2, printid);
		std::this_thread::sleep_for(std::chrono::seconds(3));
		LOG_INFO << "thread loop exits";
	}
	std::cin.get();
	return 0;
}